

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall leveldb::Footer::EncodeTo(Footer *this,string *dst)

{
  PutVarint64(dst,(this->metaindex_handle_).offset_);
  PutVarint64(dst,(this->metaindex_handle_).size_);
  PutVarint64(dst,(this->index_handle_).offset_);
  PutVarint64(dst,(this->index_handle_).size_);
  std::__cxx11::string::resize((ulong)dst,'(');
  PutFixed32(dst,0x8b80fb57);
  PutFixed32(dst,0xdb477524);
  return;
}

Assistant:

void Footer::EncodeTo(std::string* dst) const {
  const size_t original_size = dst->size();
  metaindex_handle_.EncodeTo(dst);
  index_handle_.EncodeTo(dst);
  dst->resize(2 * BlockHandle::kMaxEncodedLength);  // Padding
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber & 0xffffffffu));
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber >> 32));
  assert(dst->size() == original_size + kEncodedLength);
  (void)original_size;  // Disable unused variable warning.
}